

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4.h
# Opt level: O3

void ncnn::conv1x1s1_sgemm_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [32];
  int _h;
  uint uVar11;
  void *pvVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  int *piVar32;
  uint uVar33;
  ulong uVar34;
  long lVar35;
  undefined8 *puVar36;
  undefined1 (*pauVar37) [16];
  undefined8 *puVar38;
  void **ppvVar39;
  int iVar40;
  long lVar41;
  uint uVar42;
  long lVar44;
  long lVar45;
  int iVar46;
  ulong uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float zeros [4];
  Mat local_98;
  void *local_48;
  undefined8 uStack_40;
  ulong uVar43;
  
  uVar47 = (long)bottom_blob->h * (long)bottom_blob->w;
  _h = bottom_blob->c;
  uVar11 = top_blob->c;
  uVar20 = (uint)uVar47;
  uVar33 = uVar20 + 3;
  if (-1 < (int)uVar20) {
    uVar33 = uVar20;
  }
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  Mat::create(&local_98,4,_h,
              (uVar20 - (((uint)(uVar47 >> 0x1f) & 1) + uVar20 & 0xfffffffe)) + ((int)uVar33 >> 2) +
              (int)((char)((char)uVar47 - ((byte)uVar33 & 0xfc)) / '\x02'),bottom_blob->elemsize,
              bottom_blob->elempack,(Allocator *)opt);
  uVar33 = (int)uVar20 >> 2;
  if (0 < (int)uVar33) {
    uVar34 = 0;
    do {
      if (0 < _h) {
        puVar36 = (undefined8 *)(uVar34 * 0x40 + (long)bottom_blob->data);
        puVar38 = (undefined8 *)
                  (local_98.cstep * uVar34 *
                   CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) +
                  (long)local_98.data);
        iVar40 = _h;
        do {
          uVar29 = puVar36[1];
          uVar30 = puVar36[2];
          uVar31 = puVar36[3];
          auVar10 = *(undefined1 (*) [32])(puVar36 + 4);
          *puVar38 = *puVar36;
          puVar38[1] = uVar29;
          puVar38[2] = uVar30;
          puVar38[3] = uVar31;
          *(undefined1 (*) [32])(puVar38 + 4) = auVar10;
          puVar36 = puVar36 + bottom_blob->cstep * 2;
          puVar38 = puVar38 + 8;
          iVar40 = iVar40 + -1;
        } while (iVar40 != 0);
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 != uVar33);
  }
  if (((uVar47 >> 1 & 1) != 0) && (0 < _h)) {
    puVar38 = (undefined8 *)((long)(int)(uVar20 & 0xfffffffc) * 0x10 + (long)bottom_blob->data);
    puVar36 = (undefined8 *)
              ((long)(int)uVar33 * local_98.cstep *
               CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) + (long)local_98.data
              );
    iVar40 = _h;
    do {
      uVar29 = puVar38[1];
      uVar30 = puVar38[2];
      uVar31 = puVar38[3];
      *puVar36 = *puVar38;
      puVar36[1] = uVar29;
      puVar36[2] = uVar30;
      puVar36[3] = uVar31;
      puVar38 = puVar38 + bottom_blob->cstep * 2;
      puVar36 = puVar36 + 4;
      iVar40 = iVar40 + -1;
    } while (iVar40 != 0);
  }
  iVar40 = (uVar20 & 0xfffffffc) + ((uint)(uVar47 >> 1) & 1) * 2;
  if (iVar40 < (int)uVar20) {
    uVar34 = (ulong)iVar40;
    do {
      if (0 < _h) {
        puVar36 = (undefined8 *)(uVar34 * 0x10 + (long)bottom_blob->data);
        iVar46 = (int)uVar34;
        iVar40 = iVar46 + 3;
        if (-1 < iVar46) {
          iVar40 = iVar46;
        }
        puVar38 = (undefined8 *)
                  ((long)(int)((int)((char)((char)uVar34 - ((byte)iVar40 & 0xfc)) / '\x02') +
                              (iVar40 >> 2) +
                              (iVar46 - (((uint)(uVar34 >> 0x1f) & 1) + iVar46 & 0xfffffffe))) *
                   local_98.cstep * CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize)
                  + (long)local_98.data);
        iVar40 = _h;
        do {
          uVar29 = puVar36[1];
          *puVar38 = *puVar36;
          puVar38[1] = uVar29;
          puVar38 = puVar38 + 2;
          puVar36 = puVar36 + bottom_blob->cstep * 2;
          iVar40 = iVar40 + -1;
        } while (iVar40 != 0);
      }
      uVar34 = uVar34 + 1;
    } while ((long)uVar34 < (long)uVar47);
  }
  if (0 < (int)uVar11) {
    uVar47 = 0;
    do {
      pauVar37 = (undefined1 (*) [16])
                 (top_blob->cstep * uVar47 * top_blob->elemsize + (long)top_blob->data);
      ppvVar39 = &_bias->data + uVar47 * 2;
      if (_bias == (Mat *)0x0) {
        ppvVar39 = &local_48;
      }
      local_48 = (void *)0x0;
      uStack_40 = 0;
      if ((int)uVar20 < 4) {
        uVar34 = 0;
      }
      else {
        lVar41 = 0;
        uVar43 = 0;
        do {
          auVar48 = *(undefined1 (*) [16])ppvVar39;
          auVar54 = auVar48;
          auVar51 = auVar48;
          auVar53 = auVar48;
          if (0 < _h) {
            lVar44 = local_98.cstep *
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) * lVar41;
            lVar45 = kernel->cstep * uVar47 * kernel->elemsize;
            pvVar12 = kernel->data;
            lVar35 = 0;
            iVar40 = _h;
            do {
              fVar5 = *(float *)((long)local_98.data + lVar35 + lVar44);
              fVar6 = *(float *)((long)local_98.data + lVar35 + lVar44 + 4);
              fVar7 = *(float *)((long)local_98.data + lVar35 + lVar44 + 8);
              fVar8 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0xc);
              pfVar1 = (float *)((long)pvVar12 + lVar35 + lVar45);
              fVar21 = *pfVar1;
              fVar22 = pfVar1[1];
              fVar23 = pfVar1[2];
              fVar24 = pfVar1[3];
              pfVar1 = (float *)((long)pvVar12 + lVar35 + lVar45 + 0x10);
              fVar25 = *pfVar1;
              fVar26 = pfVar1[1];
              fVar27 = pfVar1[2];
              fVar28 = pfVar1[3];
              fVar13 = auVar48._4_4_;
              fVar14 = auVar48._8_4_;
              fVar15 = auVar48._12_4_;
              auVar52 = *(undefined1 (*) [16])((long)pvVar12 + lVar35 + lVar45 + 0x20);
              fVar16 = auVar52._0_4_;
              fVar17 = auVar52._4_4_;
              fVar18 = auVar52._8_4_;
              fVar19 = auVar52._12_4_;
              fVar9 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x10);
              auVar52 = *(undefined1 (*) [16])((long)pvVar12 + lVar35 + lVar45 + 0x30);
              fVar55 = auVar52._0_4_;
              fVar56 = auVar52._4_4_;
              fVar57 = auVar52._8_4_;
              fVar58 = auVar52._12_4_;
              auVar48._0_4_ =
                   fVar55 * fVar8 + fVar6 * fVar25 + fVar7 * fVar16 + fVar21 * fVar5 + auVar48._0_4_
              ;
              auVar48._4_4_ =
                   fVar56 * fVar8 + fVar6 * fVar26 + fVar7 * fVar17 + fVar22 * fVar5 + fVar13;
              auVar48._8_4_ =
                   fVar57 * fVar8 + fVar6 * fVar27 + fVar7 * fVar18 + fVar23 * fVar5 + fVar14;
              auVar48._12_4_ =
                   fVar58 * fVar8 + fVar6 * fVar28 + fVar7 * fVar19 + fVar24 * fVar5 + fVar15;
              fVar5 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x14);
              fVar13 = auVar54._4_4_;
              fVar14 = auVar54._8_4_;
              fVar15 = auVar54._12_4_;
              fVar6 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x18);
              fVar7 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x1c);
              fVar8 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x20);
              auVar54._0_4_ =
                   fVar55 * fVar7 + fVar5 * fVar25 + fVar6 * fVar16 + fVar9 * fVar21 + auVar54._0_4_
              ;
              auVar54._4_4_ =
                   fVar56 * fVar7 + fVar5 * fVar26 + fVar6 * fVar17 + fVar9 * fVar22 + fVar13;
              auVar54._8_4_ =
                   fVar57 * fVar7 + fVar5 * fVar27 + fVar6 * fVar18 + fVar9 * fVar23 + fVar14;
              auVar54._12_4_ =
                   fVar58 * fVar7 + fVar5 * fVar28 + fVar6 * fVar19 + fVar9 * fVar24 + fVar15;
              fVar5 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x24);
              fVar9 = auVar51._4_4_;
              fVar13 = auVar51._8_4_;
              fVar14 = auVar51._12_4_;
              fVar6 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x28);
              fVar7 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x2c);
              auVar51._0_4_ =
                   fVar55 * fVar7 + fVar5 * fVar25 + fVar6 * fVar16 + fVar8 * fVar21 + auVar51._0_4_
              ;
              auVar51._4_4_ =
                   fVar56 * fVar7 + fVar5 * fVar26 + fVar6 * fVar17 + fVar8 * fVar22 + fVar9;
              auVar51._8_4_ =
                   fVar57 * fVar7 + fVar5 * fVar27 + fVar6 * fVar18 + fVar8 * fVar23 + fVar13;
              auVar51._12_4_ =
                   fVar58 * fVar7 + fVar5 * fVar28 + fVar6 * fVar19 + fVar8 * fVar24 + fVar14;
              fVar5 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x30);
              fVar9 = auVar53._4_4_;
              fVar13 = auVar53._8_4_;
              fVar14 = auVar53._12_4_;
              fVar6 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x34);
              fVar7 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x38);
              fVar8 = *(float *)((long)local_98.data + lVar35 + lVar44 + 0x3c);
              auVar53._0_4_ =
                   fVar5 * fVar21 + auVar53._0_4_ + fVar25 * fVar6 + fVar16 * fVar7 + fVar55 * fVar8
              ;
              auVar53._4_4_ =
                   fVar5 * fVar22 + fVar9 + fVar26 * fVar6 + fVar17 * fVar7 + fVar56 * fVar8;
              auVar53._8_4_ =
                   fVar5 * fVar23 + fVar13 + fVar27 * fVar6 + fVar18 * fVar7 + fVar57 * fVar8;
              auVar53._12_4_ =
                   fVar5 * fVar24 + fVar14 + fVar28 * fVar6 + fVar19 * fVar7 + fVar58 * fVar8;
              lVar35 = lVar35 + 0x40;
              iVar40 = iVar40 + -1;
            } while (iVar40 != 0);
          }
          *pauVar37 = auVar48;
          pauVar37[1] = auVar54;
          pauVar37[2] = auVar51;
          pauVar37[3] = auVar53;
          pauVar37 = pauVar37 + 4;
          uVar34 = uVar43 + 4;
          lVar35 = uVar43 + 7;
          lVar41 = lVar41 + 1;
          uVar43 = uVar34;
        } while (lVar35 < (int)uVar20);
      }
      if ((int)((uint)uVar34 | 1) < (int)uVar20) {
        uVar33 = 0;
        do {
          auVar52 = *(undefined1 (*) [16])ppvVar39;
          iVar40 = (int)uVar34;
          auVar49 = auVar52;
          if (0 < _h) {
            lVar35 = kernel->cstep * uVar47 * kernel->elemsize;
            pvVar12 = kernel->data;
            lVar41 = local_98.cstep *
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                     (ulong)((uVar33 & 1) + ((uint)(uVar34 >> 2) & 0x3fffffff));
            lVar44 = 0;
            iVar46 = _h;
            do {
              fVar5 = *(float *)((long)local_98.data + lVar44 + lVar41);
              fVar6 = *(float *)((long)local_98.data + lVar44 + lVar41 + 4);
              fVar7 = *(float *)((long)local_98.data + lVar44 + lVar41 + 8);
              fVar8 = *(float *)((long)local_98.data + lVar44 + lVar41 + 0xc);
              fVar9 = *(float *)((long)local_98.data + lVar44 + lVar41 + 0x10);
              fVar13 = *(float *)((long)local_98.data + lVar44 + lVar41 + 0x14);
              fVar14 = *(float *)((long)local_98.data + lVar44 + lVar41 + 0x18);
              fVar15 = *(float *)((long)local_98.data + lVar44 + lVar41 + 0x1c);
              auVar48 = *(undefined1 (*) [16])((long)pvVar12 + lVar44 * 2 + lVar35);
              auVar51 = *(undefined1 (*) [16])((long)pvVar12 + lVar44 * 2 + lVar35 + 0x10);
              auVar53 = *(undefined1 (*) [16])((long)pvVar12 + lVar44 * 2 + lVar35 + 0x20);
              auVar54 = *(undefined1 (*) [16])((long)pvVar12 + lVar44 * 2 + lVar35 + 0x30);
              fVar16 = auVar52._4_4_;
              fVar17 = auVar52._8_4_;
              fVar18 = auVar52._12_4_;
              auVar52._0_4_ =
                   auVar48._0_4_ * fVar5 + auVar52._0_4_ +
                   auVar51._0_4_ * fVar6 + auVar53._0_4_ * fVar7 + auVar54._0_4_ * fVar8;
              auVar52._4_4_ =
                   auVar48._4_4_ * fVar5 + fVar16 + auVar51._4_4_ * fVar6 + auVar53._4_4_ * fVar7 +
                   auVar54._4_4_ * fVar8;
              auVar52._8_4_ =
                   auVar48._8_4_ * fVar5 + fVar17 + auVar51._8_4_ * fVar6 + auVar53._8_4_ * fVar7 +
                   auVar54._8_4_ * fVar8;
              auVar52._12_4_ =
                   auVar48._12_4_ * fVar5 + fVar18 + auVar51._12_4_ * fVar6 + auVar53._12_4_ * fVar7
                   + auVar54._12_4_ * fVar8;
              fVar5 = auVar49._4_4_;
              fVar6 = auVar49._8_4_;
              fVar7 = auVar49._12_4_;
              auVar49._0_4_ =
                   auVar48._0_4_ * fVar9 + auVar49._0_4_ +
                   auVar51._0_4_ * fVar13 + auVar53._0_4_ * fVar14 + auVar54._0_4_ * fVar15;
              auVar49._4_4_ =
                   auVar48._4_4_ * fVar9 + fVar5 + auVar51._4_4_ * fVar13 + auVar53._4_4_ * fVar14 +
                   auVar54._4_4_ * fVar15;
              auVar49._8_4_ =
                   auVar48._8_4_ * fVar9 + fVar6 + auVar51._8_4_ * fVar13 + auVar53._8_4_ * fVar14 +
                   auVar54._8_4_ * fVar15;
              auVar49._12_4_ =
                   auVar48._12_4_ * fVar9 + fVar7 +
                   auVar51._12_4_ * fVar13 + auVar53._12_4_ * fVar14 + auVar54._12_4_ * fVar15;
              lVar44 = lVar44 + 0x20;
              iVar46 = iVar46 + -1;
            } while (iVar46 != 0);
          }
          *pauVar37 = auVar52;
          pauVar37[1] = auVar49;
          pauVar37 = pauVar37 + 2;
          uVar42 = iVar40 + 2;
          uVar43 = (ulong)uVar42;
          uVar33 = (uint)(byte)((char)uVar33 + 1);
          uVar34 = (ulong)uVar42;
        } while (iVar40 + 3 < (int)uVar20);
      }
      else {
        uVar43 = uVar34 & 0xffffffff;
      }
      if ((int)uVar43 < (int)uVar20) {
        do {
          uVar33 = (uint)uVar43;
          auVar50 = *(undefined1 (*) [16])ppvVar39;
          if (0 < _h) {
            lVar41 = kernel->cstep * uVar47 * kernel->elemsize;
            pvVar12 = kernel->data;
            lVar35 = local_98.cstep *
                     CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize) *
                     (ulong)((uVar33 & 1) + (int)(uVar43 >> 2) + (uint)((uVar33 >> 1 & 1) != 0));
            lVar44 = 0;
            iVar40 = _h;
            do {
              fVar5 = *(float *)((long)local_98.data + lVar44 + lVar35);
              fVar6 = *(float *)((long)local_98.data + lVar44 + lVar35 + 4);
              fVar7 = *(float *)((long)local_98.data + lVar44 + lVar35 + 8);
              fVar8 = *(float *)((long)local_98.data + lVar44 + lVar35 + 0xc);
              pfVar1 = (float *)((long)pvVar12 + lVar44 * 4 + lVar41);
              pfVar2 = (float *)((long)pvVar12 + lVar44 * 4 + lVar41 + 0x10);
              pfVar3 = (float *)((long)pvVar12 + lVar44 * 4 + lVar41 + 0x20);
              fVar9 = auVar50._4_4_;
              fVar13 = auVar50._8_4_;
              fVar14 = auVar50._12_4_;
              pfVar4 = (float *)((long)pvVar12 + lVar44 * 4 + lVar41 + 0x30);
              auVar50._0_4_ =
                   fVar5 * *pfVar1 + auVar50._0_4_ + fVar6 * *pfVar2 + fVar7 * *pfVar3 +
                   fVar8 * *pfVar4;
              auVar50._4_4_ =
                   fVar5 * pfVar1[1] + fVar9 + fVar6 * pfVar2[1] + fVar7 * pfVar3[1] +
                   fVar8 * pfVar4[1];
              auVar50._8_4_ =
                   fVar5 * pfVar1[2] + fVar13 + fVar6 * pfVar2[2] + fVar7 * pfVar3[2] +
                   fVar8 * pfVar4[2];
              auVar50._12_4_ =
                   fVar5 * pfVar1[3] + fVar14 + fVar6 * pfVar2[3] + fVar7 * pfVar3[3] +
                   fVar8 * pfVar4[3];
              lVar44 = lVar44 + 0x10;
              iVar40 = iVar40 + -1;
            } while (iVar40 != 0);
          }
          *pauVar37 = auVar50;
          pauVar37 = pauVar37 + 1;
          uVar43 = (ulong)(uVar33 + 1);
        } while (uVar33 + 1 != uVar20);
      }
      uVar47 = uVar47 + 1;
    } while (uVar47 != uVar11);
  }
  piVar32 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar32 != (int *)0x0) {
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    int outch = top_blob.c;

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int size = w * h;

    const float* bias = _bias;

    // interleave
    Mat tmp(4, inch, size / 4 + (size % 4) / 2 + size % 2, elemsize, elempack, opt.workspace_allocator);
    {
        int nn_size;
        int remain_size_start;

        remain_size_start = 0;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                __m128 _r1 = _mm_loadu_ps(img0 + 4);
                __m128 _r2 = _mm_loadu_ps(img0 + 8);
                __m128 _r3 = _mm_loadu_ps(img0 + 12);
                _mm_storeu_ps(tmpptr, _r0);
                _mm_storeu_ps(tmpptr + 4, _r1);
                _mm_storeu_ps(tmpptr + 8, _r2);
                _mm_storeu_ps(tmpptr + 12, _r3);

                tmpptr += 16;
                img0 += bottom_blob.cstep * 4;
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                __m128 _r1 = _mm_loadu_ps(img0 + 4);
                _mm_storeu_ps(tmpptr, _r0);
                _mm_storeu_ps(tmpptr + 4, _r1);

                tmpptr += 8;
                img0 += bottom_blob.cstep * 4;
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                _mm_storeu_ps(tmpptr, _r0);

                tmpptr += 4;
                img0 += bottom_blob.cstep * 4;
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 4);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _mm_loadu_ps(biasptr);
            __m128 _sum2 = _mm_loadu_ps(biasptr);
            __m128 _sum3 = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val00 = _mm_load1_ps(tmpptr);
                __m128 _val01 = _mm_load1_ps(tmpptr + 1);
                __m128 _val02 = _mm_load1_ps(tmpptr + 2);
                __m128 _val03 = _mm_load1_ps(tmpptr + 3);
                __m128 _val10 = _mm_load1_ps(tmpptr + 4);
                __m128 _val11 = _mm_load1_ps(tmpptr + 5);
                __m128 _val12 = _mm_load1_ps(tmpptr + 6);
                __m128 _val13 = _mm_load1_ps(tmpptr + 7);
                __m128 _val20 = _mm_load1_ps(tmpptr + 8);
                __m128 _val21 = _mm_load1_ps(tmpptr + 9);
                __m128 _val22 = _mm_load1_ps(tmpptr + 10);
                __m128 _val23 = _mm_load1_ps(tmpptr + 11);
                __m128 _val30 = _mm_load1_ps(tmpptr + 12);
                __m128 _val31 = _mm_load1_ps(tmpptr + 13);
                __m128 _val32 = _mm_load1_ps(tmpptr + 14);
                __m128 _val33 = _mm_load1_ps(tmpptr + 15);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum0 = _mm_comp_fmadd_ps(_w0, _val00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w1, _val01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w2, _val02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w3, _val03, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w1, _val11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w2, _val12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w3, _val13, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_w0, _val20, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w1, _val21, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w2, _val22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w3, _val23, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_w0, _val30, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w1, _val31, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w2, _val32, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w3, _val33, _sum3);

                tmpptr += 16;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            outptr0 += 16;
        }
        for (; i + 1 < size; i += 2)
        {
            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val00 = _mm_load1_ps(tmpptr);
                __m128 _val01 = _mm_load1_ps(tmpptr + 1);
                __m128 _val02 = _mm_load1_ps(tmpptr + 2);
                __m128 _val03 = _mm_load1_ps(tmpptr + 3);
                __m128 _val10 = _mm_load1_ps(tmpptr + 4);
                __m128 _val11 = _mm_load1_ps(tmpptr + 5);
                __m128 _val12 = _mm_load1_ps(tmpptr + 6);
                __m128 _val13 = _mm_load1_ps(tmpptr + 7);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum0 = _mm_comp_fmadd_ps(_w0, _val00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w1, _val01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w2, _val02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w3, _val03, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w1, _val11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w2, _val12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w3, _val13, _sum1);

                tmpptr += 8;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum = _mm_comp_fmadd_ps(_w0, _val0, _sum);
                _sum = _mm_comp_fmadd_ps(_w1, _val1, _sum);
                _sum = _mm_comp_fmadd_ps(_w2, _val2, _sum);
                _sum = _mm_comp_fmadd_ps(_w3, _val3, _sum);

                tmpptr += 4;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum);
            outptr0 += 4;
        }
    }

    //     // NOTE sgemm
    //     for (; p<outch; p++)
    //     {
    //         Mat out0 = top_blob.channel(p);
    //
    //         const float bias0 = bias ? bias[p] : 0.f;
    //
    //         float* outptr0 = out0;
    //
    //         for (int i=0; i<size; i++)
    //         {
    //             float sum = bias0;
    //
    //             const float* kptr = _kernel.channel(p);
    //
    //             for (int q=0; q<inch; q++)
    //             {
    //                 const float* img0 = bottom_blob.channel(q);
    //
    //                 sum += img0[i] * kptr[0];
    //                 kptr ++;
    //             }
    //
    //             outptr0[i] = sum;
    //         }
    //     }
}